

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cmMakefile.cxx
# Opt level: O1

void __thiscall cmMakefile::ConfigureSubDirectory(cmMakefile *this,cmMakefile *mf)

{
  bool bVar1;
  PolicyStatus PVar2;
  char *pcVar3;
  ostream *poVar4;
  PolicyID id;
  PolicyID id_00;
  string msg_1;
  string currentStart;
  string currentStartFile;
  string msg;
  string local_1f0;
  long *local_1d0;
  long local_1c8;
  long local_1c0 [2];
  string local_1b0;
  undefined1 local_190 [16];
  cmLinkedTree<cmStateDetail::BuildsystemDirectoryStateType> local_180 [2];
  ios_base local_120 [264];
  
  InitializeFromParent(mf,this);
  cmStateSnapshot::GetDirectory((cmStateDirectory *)local_190,&mf->StateSnapshot);
  pcVar3 = cmStateDirectory::GetCurrentSource((cmStateDirectory *)local_190);
  std::__cxx11::string::string((string *)&local_1d0,pcVar3,(allocator *)local_190);
  if (this->GlobalGenerator->CMakeInstance->DebugOutput == true) {
    local_190._0_8_ = local_180;
    std::__cxx11::string::_M_construct<char_const*>
              ((string *)local_190,"   Entering             ","");
    std::__cxx11::string::_M_append(local_190,(ulong)local_1d0);
    cmSystemTools::Message((char *)local_190._0_8_,(char *)0x0);
    if ((cmLinkedTree<cmStateDetail::BuildsystemDirectoryStateType> *)local_190._0_8_ != local_180)
    {
      operator_delete((void *)local_190._0_8_,
                      (ulong)&(((map<cmProperty::ScopeType,_cmPropertyDefinitionMap,_std::less<cmProperty::ScopeType>,_std::allocator<std::pair<const_cmProperty::ScopeType,_cmPropertyDefinitionMap>_>_>
                                 *)&(local_180[0].Data.
                                     super__Vector_base<cmStateDetail::BuildsystemDirectoryStateType,_std::allocator<cmStateDetail::BuildsystemDirectoryStateType>_>
                                     ._M_impl.super__Vector_impl_data._M_start)->DirectoryEnd)->_M_t
                              )._M_impl.field_0x1);
    }
  }
  local_1b0._M_dataplus._M_p = (pointer)&local_1b0.field_2;
  std::__cxx11::string::_M_construct<char*>
            ((string *)&local_1b0,local_1d0,(long)local_1d0 + local_1c8);
  std::__cxx11::string::append((char *)&local_1b0);
  bVar1 = cmsys::SystemTools::FileExists(&local_1b0,true);
  if (bVar1) {
    Configure(mf);
    if (this->GlobalGenerator->CMakeInstance->DebugOutput == true) {
      local_1f0._M_dataplus._M_p = (pointer)&local_1f0.field_2;
      std::__cxx11::string::_M_construct<char_const*>
                ((string *)&local_1f0,"   Returning to         ","");
      cmStateSnapshot::GetDirectory((cmStateDirectory *)local_190,&this->StateSnapshot);
      cmStateDirectory::GetCurrentSource((cmStateDirectory *)local_190);
      std::__cxx11::string::append((char *)&local_1f0);
      cmSystemTools::Message(local_1f0._M_dataplus._M_p,(char *)0x0);
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_1f0._M_dataplus._M_p != &local_1f0.field_2) {
        operator_delete(local_1f0._M_dataplus._M_p,local_1f0.field_2._M_allocated_capacity + 1);
      }
    }
    goto LAB_00363246;
  }
  std::__cxx11::ostringstream::ostringstream((ostringstream *)local_190);
  std::__ostream_insert<char,std::char_traits<char>>
            ((ostream *)local_190,"The source directory\n",0x15);
  std::__ostream_insert<char,std::char_traits<char>>((ostream *)local_190,"  ",2);
  poVar4 = std::__ostream_insert<char,std::char_traits<char>>
                     ((ostream *)local_190,(char *)local_1d0,local_1c8);
  std::__ostream_insert<char,std::char_traits<char>>(poVar4,"\n",1);
  std::__ostream_insert<char,std::char_traits<char>>
            (poVar4,"does not contain a CMakeLists.txt file.",0x27);
  PVar2 = cmStateSnapshot::GetPolicy(&this->StateSnapshot,CMP0014);
  if (PVar2 - REQUIRED_IF_USED < 2) {
    std::__ostream_insert<char,std::char_traits<char>>((ostream *)local_190,"\n",1);
    cmPolicies::GetRequiredPolicyError_abi_cxx11_(&local_1f0,(cmPolicies *)0xe,id);
    std::__ostream_insert<char,std::char_traits<char>>
              ((ostream *)local_190,local_1f0._M_dataplus._M_p,local_1f0._M_string_length);
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_1f0._M_dataplus._M_p != &local_1f0.field_2) {
      operator_delete(local_1f0._M_dataplus._M_p,local_1f0.field_2._M_allocated_capacity + 1);
    }
LAB_003631ec:
    std::__cxx11::stringbuf::str();
    IssueMessage(this,FATAL_ERROR,&local_1f0);
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_1f0._M_dataplus._M_p != &local_1f0.field_2) {
LAB_0036321b:
      operator_delete(local_1f0._M_dataplus._M_p,local_1f0.field_2._M_allocated_capacity + 1);
    }
  }
  else if (PVar2 == WARN) {
    std::__ostream_insert<char,std::char_traits<char>>((ostream *)local_190,"\n",1);
    std::__ostream_insert<char,std::char_traits<char>>
              ((ostream *)local_190,"CMake does not support this case but it used ",0x2d);
    std::__ostream_insert<char,std::char_traits<char>>
              ((ostream *)local_190,"to work accidentally and is being allowed for ",0x2e);
    std::__ostream_insert<char,std::char_traits<char>>((ostream *)local_190,"compatibility.",0xe);
    std::__ostream_insert<char,std::char_traits<char>>((ostream *)local_190,"\n",1);
    cmPolicies::GetPolicyWarning_abi_cxx11_(&local_1f0,(cmPolicies *)0xe,id_00);
    std::__ostream_insert<char,std::char_traits<char>>
              ((ostream *)local_190,local_1f0._M_dataplus._M_p,local_1f0._M_string_length);
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_1f0._M_dataplus._M_p != &local_1f0.field_2) {
      operator_delete(local_1f0._M_dataplus._M_p,local_1f0.field_2._M_allocated_capacity + 1);
    }
    std::__cxx11::stringbuf::str();
    IssueMessage(this,AUTHOR_WARNING,&local_1f0);
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_1f0._M_dataplus._M_p != &local_1f0.field_2) goto LAB_0036321b;
  }
  else if (PVar2 == NEW) goto LAB_003631ec;
  std::__cxx11::ostringstream::~ostringstream((ostringstream *)local_190);
  std::ios_base::~ios_base(local_120);
LAB_00363246:
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_1b0._M_dataplus._M_p != &local_1b0.field_2) {
    operator_delete(local_1b0._M_dataplus._M_p,local_1b0.field_2._M_allocated_capacity + 1);
  }
  if (local_1d0 != local_1c0) {
    operator_delete(local_1d0,local_1c0[0] + 1);
  }
  return;
}

Assistant:

void cmMakefile::ConfigureSubDirectory(cmMakefile* mf)
{
  mf->InitializeFromParent(this);
  std::string currentStart = mf->GetCurrentSourceDirectory();
  if (this->GetCMakeInstance()->GetDebugOutput()) {
    std::string msg = "   Entering             ";
    msg += currentStart;
    cmSystemTools::Message(msg.c_str());
  }

  std::string const currentStartFile = currentStart + "/CMakeLists.txt";
  if (!cmSystemTools::FileExists(currentStartFile, true)) {
    // The file is missing.  Check policy CMP0014.
    std::ostringstream e;
    /* clang-format off */
    e << "The source directory\n"
      << "  " << currentStart << "\n"
      << "does not contain a CMakeLists.txt file.";
    /* clang-format on */
    switch (this->GetPolicyStatus(cmPolicies::CMP0014)) {
      case cmPolicies::WARN:
        // Print the warning.
        /* clang-format off */
        e << "\n"
          << "CMake does not support this case but it used "
          << "to work accidentally and is being allowed for "
          << "compatibility."
          << "\n"
          << cmPolicies::GetPolicyWarning(cmPolicies::CMP0014);
        /* clang-format on */
        this->IssueMessage(cmake::AUTHOR_WARNING, e.str());
      case cmPolicies::OLD:
        // OLD behavior does not warn.
        break;
      case cmPolicies::REQUIRED_IF_USED:
      case cmPolicies::REQUIRED_ALWAYS:
        e << "\n" << cmPolicies::GetRequiredPolicyError(cmPolicies::CMP0014);
        CM_FALLTHROUGH;
      case cmPolicies::NEW:
        // NEW behavior prints the error.
        this->IssueMessage(cmake::FATAL_ERROR, e.str());
    }
    return;
  }
  // finally configure the subdir
  mf->Configure();

  if (this->GetCMakeInstance()->GetDebugOutput()) {
    std::string msg = "   Returning to         ";
    msg += this->GetCurrentSourceDirectory();
    cmSystemTools::Message(msg.c_str());
  }
}